

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[163]>(String *__return_storage_ptr__,kj *this,char (*params) [163])

{
  char (*value) [163];
  ArrayPtr<const_char> local_28;
  kj *local_18;
  char (*params_local) [163];
  
  local_18 = this;
  params_local = (char (*) [163])__return_storage_ptr__;
  value = ::const((char (*) [163])this);
  local_28 = toCharSequence<char_const(&)[163]>(value);
  _::concat<kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)local_28.size_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}